

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_supported_elliptic_curves(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_ecp_curve_info *pmVar1;
  mbedtls_ecp_curve_info **local_50;
  mbedtls_ecp_curve_info **curves;
  mbedtls_ecp_curve_info *curve_info;
  uchar *p;
  size_t our_size;
  size_t list_size;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  our_size = (size_t)(int)(uint)CONCAT11(*buf,buf[1]);
  if ((our_size + 2 == len) && ((our_size & 1) == 0)) {
    if (ssl->handshake->curves == (mbedtls_ecp_curve_info **)0x0) {
      p = (uchar *)((our_size >> 1) + 1);
      if ((uchar *)0xc < p) {
        p = (uchar *)0xc;
      }
      local_50 = (mbedtls_ecp_curve_info **)calloc((size_t)p,8);
      if (local_50 == (mbedtls_ecp_curve_info **)0x0) {
        ssl_local._4_4_ = -0x7f00;
      }
      else {
        ssl->handshake->curves = local_50;
        curve_info = (mbedtls_ecp_curve_info *)(buf + 2);
        for (; our_size != 0 && (uchar *)0x1 < p; our_size = our_size - 2) {
          pmVar1 = mbedtls_ecp_curve_info_from_tls_id
                             (CONCAT11((char)curve_info->grp_id,
                                       *(byte *)((long)&curve_info->grp_id + 1)));
          if (pmVar1 != (mbedtls_ecp_curve_info *)0x0) {
            *local_50 = pmVar1;
            p = p + -1;
            local_50 = local_50 + 1;
          }
          curve_info = (mbedtls_ecp_curve_info *)((long)&curve_info->grp_id + 2);
        }
        ssl_local._4_4_ = 0;
      }
    }
    else {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x100,"bad client hello message");
      ssl_local._4_4_ = -0x7900;
    }
  }
  else {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xf9,"bad client hello message");
    ssl_local._4_4_ = -0x7900;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_supported_elliptic_curves( mbedtls_ssl_context *ssl,
                                                const unsigned char *buf,
                                                size_t len )
{
    size_t list_size, our_size;
    const unsigned char *p;
    const mbedtls_ecp_curve_info *curve_info, **curves;

    list_size = ( ( buf[0] << 8 ) | ( buf[1] ) );
    if( list_size + 2 != len ||
        list_size % 2 != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    /* Should never happen unless client duplicates the extension */
    if( ssl->handshake->curves != NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    /* Don't allow our peer to make us allocate too much memory,
     * and leave room for a final 0 */
    our_size = list_size / 2 + 1;
    if( our_size > MBEDTLS_ECP_DP_MAX )
        our_size = MBEDTLS_ECP_DP_MAX;

    if( ( curves = mbedtls_calloc( our_size, sizeof( *curves ) ) ) == NULL )
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

    ssl->handshake->curves = curves;

    p = buf + 2;
    while( list_size > 0 && our_size > 1 )
    {
        curve_info = mbedtls_ecp_curve_info_from_tls_id( ( p[0] << 8 ) | p[1] );

        if( curve_info != NULL )
        {
            *curves++ = curve_info;
            our_size--;
        }

        list_size -= 2;
        p += 2;
    }

    return( 0 );
}